

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

size_t __thiscall
brotli::HashToBinaryTree::FindAllMatches
          (HashToBinaryTree *this,uint8_t *data,size_t ring_buffer_mask,size_t cur_ix,
          size_t max_length,size_t max_backward,BackwardMatch *matches)

{
  size_t max_length_00;
  bool bVar1;
  BackwardMatch *dist;
  ulong uVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  uint8_t *data_00;
  reference pvVar5;
  long lVar6;
  BackwardMatch local_e4;
  uint local_dc;
  size_type sStack_d8;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  unsigned_long local_c0;
  size_t local_b8;
  size_t minlen;
  allocator<unsigned_int> local_99;
  undefined1 local_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dict_matches;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i;
  size_t stop;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  size_t max_backward_local;
  size_t max_length_local;
  size_t cur_ix_local;
  size_t ring_buffer_mask_local;
  uint8_t *data_local;
  HashToBinaryTree *this_local;
  
  cur_ix_masked = (size_t)matches;
  best_len = cur_ix & ring_buffer_mask;
  stop = 1;
  i = cur_ix - 0x40;
  if (cur_ix < 0x40) {
    i = 0;
  }
  orig_matches = (BackwardMatch *)max_backward;
  max_backward_local = max_length;
  max_length_local = cur_ix;
  cur_ix_local = ring_buffer_mask;
  ring_buffer_mask_local = (size_t)data;
  data_local = (uint8_t *)this;
  for (prev_ix = cur_ix - 1;
      (i < prev_ix && stop < 3 &&
      (dist = (BackwardMatch *)(max_length_local - prev_ix), dist <= orig_matches));
      prev_ix = prev_ix - 1) {
    uVar2 = cur_ix_local & prev_ix;
    if (((*(char *)(ring_buffer_mask_local + best_len) == *(char *)(ring_buffer_mask_local + uVar2))
        && (*(char *)(ring_buffer_mask_local + 1 + best_len) ==
            *(char *)(ring_buffer_mask_local + 1 + uVar2))) &&
       (sVar3 = FindMatchLengthWithLimit
                          ((uint8_t *)(ring_buffer_mask_local + uVar2),
                           (uint8_t *)(ring_buffer_mask_local + best_len),max_backward_local),
       stop < sVar3)) {
      stop = sVar3;
      BackwardMatch::BackwardMatch
                ((BackwardMatch *)
                 &dict_matches.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(size_t)dist,sVar3);
      *matches = (BackwardMatch)
                 dict_matches.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      matches = matches + 1;
    }
  }
  if (stop < max_backward_local) {
    matches = StoreAndFindMatches(this,(uint8_t *)ring_buffer_mask_local,max_length_local,
                                  cur_ix_local,max_backward_local,&stop,matches);
  }
  std::allocator<unsigned_int>::allocator(&local_99);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,0x26,&kInvalidMatch,
             &local_99);
  std::allocator<unsigned_int>::~allocator(&local_99);
  local_c0 = 4;
  maxlen = stop + 1;
  puVar4 = std::max<unsigned_long>(&local_c0,&maxlen);
  max_length_00 = max_backward_local;
  sVar3 = *puVar4;
  data_00 = (uint8_t *)(ring_buffer_mask_local + best_len);
  local_b8 = sVar3;
  pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,0);
  bVar1 = FindAllStaticDictionaryMatches(data_00,sVar3,max_length_00,pvVar5);
  if (bVar1) {
    puVar4 = std::min<unsigned_long>(&kMaxDictionaryMatchLen,&max_backward_local);
    l = *puVar4;
    for (sStack_d8 = local_b8; sStack_d8 <= l; sStack_d8 = sStack_d8 + 1) {
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,sStack_d8)
      ;
      local_dc = *pvVar5;
      if (local_dc < 0xfffffff) {
        BackwardMatch::BackwardMatch
                  (&local_e4,(long)&orig_matches->distance + (ulong)(local_dc >> 5) + 1,sStack_d8,
                   (ulong)(local_dc & 0x1f));
        *matches = local_e4;
        matches = matches + 1;
      }
    }
  }
  lVar6 = (long)matches - cur_ix_masked;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  return lVar6 >> 3;
}

Assistant:

size_t FindAllMatches(const uint8_t* data,
                        const size_t ring_buffer_mask,
                        const size_t cur_ix,
                        const size_t max_length,
                        const size_t max_backward,
                        BackwardMatch* matches) {
    BackwardMatch* const orig_matches = matches;
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    size_t best_len = 1;
    size_t stop = cur_ix - 64;
    if (cur_ix < 64) { stop = 0; }
    for (size_t i = cur_ix - 1; i > stop && best_len <= 2; --i) {
      size_t prev_ix = i;
      const size_t backward = cur_ix - prev_ix;
      if (PREDICT_FALSE(backward > max_backward)) {
        break;
      }
      prev_ix &= ring_buffer_mask;
      if (data[cur_ix_masked] != data[prev_ix] ||
          data[cur_ix_masked + 1] != data[prev_ix + 1]) {
        continue;
      }
      const size_t len =
          FindMatchLengthWithLimit(&data[prev_ix], &data[cur_ix_masked],
                                   max_length);
      if (len > best_len) {
        best_len = len;
        *matches++ = BackwardMatch(backward, len);
      }
    }
    if (best_len < max_length) {
      matches = StoreAndFindMatches(data, cur_ix, ring_buffer_mask,
                                    max_length, &best_len, matches);
    }
    std::vector<uint32_t> dict_matches(kMaxDictionaryMatchLen + 1,
                                       kInvalidMatch);
    size_t minlen = std::max<size_t>(4, best_len + 1);
    if (FindAllStaticDictionaryMatches(&data[cur_ix_masked], minlen, max_length,
                                       &dict_matches[0])) {
      size_t maxlen = std::min<size_t>(kMaxDictionaryMatchLen, max_length);
      for (size_t l = minlen; l <= maxlen; ++l) {
        uint32_t dict_id = dict_matches[l];
        if (dict_id < kInvalidMatch) {
          *matches++ = BackwardMatch(max_backward + (dict_id >> 5) + 1, l,
                                     dict_id & 31);
        }
      }
    }
    return static_cast<size_t>(matches - orig_matches);
  }